

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall fmt::v8::detail::bigint::multiply(bigint *this,uint64_t value)

{
  uint uVar1;
  uint *puVar2;
  uint local_54;
  ulong local_50;
  double_bigit result;
  size_t n;
  size_t i;
  double_bigit carry;
  double_bigit upper;
  double_bigit lower;
  uint64_t uStack_18;
  bigit mask;
  uint64_t value_local;
  bigint *this_local;
  
  lower._4_4_ = 0xffffffff;
  upper = value & 0xffffffff;
  carry = value >> 0x20;
  i = 0;
  n = 0;
  uStack_18 = value;
  value_local = (uint64_t)this;
  result = buffer<unsigned_int>::size((buffer<unsigned_int> *)this);
  for (; n < result; n = n + 1) {
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
    local_50 = *puVar2 * upper + (i & 0xffffffff);
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
    i = *puVar2 * carry + (local_50 >> 0x20) + (i >> 0x20);
    uVar1 = (uint)local_50;
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)this,n);
    *puVar2 = uVar1;
  }
  for (; i != 0; i = i >> 0x20) {
    local_54 = (uint)i;
    buffer<unsigned_int>::push_back((buffer<unsigned_int> *)this,&local_54);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void multiply(uint64_t value) {
    const bigit mask = ~bigit(0);
    const double_bigit lower = value & mask;
    const double_bigit upper = value >> bigit_bits;
    double_bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * lower + (carry & mask);
      carry =
          bigits_[i] * upper + (result >> bigit_bits) + (carry >> bigit_bits);
      bigits_[i] = static_cast<bigit>(result);
    }
    while (carry != 0) {
      bigits_.push_back(carry & mask);
      carry >>= bigit_bits;
    }
  }